

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O0

Graph * GraphBase::load_graph
                  (Graph *__return_storage_ptr__,string *graphName,bool isReverse,string *probDist,
                  float probEdge)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  reference pvVar4;
  size_type sVar5;
  reference ppVar6;
  reference pvVar7;
  time_t tVar8;
  undefined1 auVar9 [16];
  pair<unsigned_int,_float> *nbr_4;
  iterator __end5;
  iterator __begin5;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *__range5
  ;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_4;
  iterator __end4_4;
  iterator __begin4_4;
  Graph *__range4_4;
  pair<unsigned_int,_float> *nbr_3;
  iterator __end4_3;
  iterator __begin4_3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *__range4_3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_3;
  iterator __end3_3;
  iterator __begin3_3;
  Graph *__range3_3;
  float pProb [3];
  pair<unsigned_int,_float> *nbr_2;
  iterator __end4_2;
  iterator __begin4_2;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *__range4_2;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_2;
  iterator __end3_2;
  iterator __begin3_2;
  Graph *__range3_2;
  pair<unsigned_int,_float> *nbr_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *__range4_1;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_1;
  iterator __end3_1;
  iterator __begin3_1;
  Graph *__range3_1;
  undefined1 local_100 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecInDeg;
  pair<unsigned_int,_float> *nbr;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *__range4
  ;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  iterator __end3;
  iterator __begin3;
  Graph *__range3;
  string local_98;
  undefined1 local_75;
  float local_74;
  string *psStack_70;
  float probEdge_local;
  string *probDist_local;
  string *psStack_60;
  bool isReverse_local;
  string *graphName_local;
  Graph *graph;
  undefined4 local_48;
  uint local_44;
  dsfmt_t *local_40;
  uint64_t *psfmt64;
  dsfmt_t *pdStack_30;
  uint32_t r;
  undefined4 local_24;
  dsfmt_t *local_20;
  uint32_t local_14;
  dsfmt_t *local_10;
  
  local_75 = 0;
  local_74 = probEdge;
  psStack_70 = probDist;
  probDist_local._7_1_ = isReverse;
  psStack_60 = graphName;
  graphName_local = (string *)__return_storage_ptr__;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_98,(string *)graphName);
  IOcontroller::load_graph_struct(&local_98,__return_storage_ptr__,(bool)(probDist_local._7_1_ & 1))
  ;
  std::__cxx11::string::~string((string *)&local_98);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)probDist);
  iVar2 = tolower((int)*pcVar3);
  if (iVar2 == 0x77) {
    if ((probDist_local._7_1_ & 1) == 0) {
      sVar5 = std::
              vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ::size(__return_storage_ptr__);
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range3_1 + 7));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,sVar5,
                 (allocator<unsigned_int> *)((long)&__range3_1 + 7));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range3_1 + 7));
      __end3_1 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::begin(__return_storage_ptr__);
      nbrs_1 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)std::
                  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ::end(__return_storage_ptr__);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                 *)&nbrs_1), bVar1) {
        pvVar4 = __gnu_cxx::
                 __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                 ::operator*(&__end3_1);
        __end4_1 = std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::begin(pvVar4);
        nbr_1 = (pair<unsigned_int,_float> *)
                std::
                vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::end(pvVar4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)&nbr_1), bVar1) {
          ppVar6 = __gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                   ::operator*(&__end4_1);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                              (ulong)ppVar6->first);
          *pvVar7 = *pvVar7 + 1;
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end4_1);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
        ::operator++(&__end3_1);
      }
      __end3_2 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::begin(__return_storage_ptr__);
      nbrs_2 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)std::
                  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ::end(__return_storage_ptr__);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                 *)&nbrs_2), bVar1) {
        pvVar4 = __gnu_cxx::
                 __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                 ::operator*(&__end3_2);
        __end4_2 = std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::begin(pvVar4);
        nbr_2 = (pair<unsigned_int,_float> *)
                std::
                vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::end(pvVar4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_2,
                                  (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)&nbr_2), bVar1) {
          pProb._4_8_ = __gnu_cxx::
                        __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                        ::operator*(&__end4_2);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                              (ulong)((reference)pProb._4_8_)->first);
          *(float *)(pProb._4_8_ + 4) = 1.0 / (float)*pvVar7;
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end4_2);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
        ::operator++(&__end3_2);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
    }
    else {
      __end3 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::begin(__return_storage_ptr__);
      nbrs = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              *)std::
                vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ::end(__return_storage_ptr__);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                         *)&nbrs), bVar1) {
        pvVar4 = __gnu_cxx::
                 __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                 ::operator*(&__end3);
        __end4 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::begin(pvVar4);
        nbr = (pair<unsigned_int,_float> *)
              std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::end(pvVar4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                           *)&nbr), bVar1) {
          vecInDeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               &__gnu_cxx::
                __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                ::operator*(&__end4)->first;
          sVar5 = std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::size(pvVar4);
          auVar9._8_4_ = (int)(sVar5 >> 0x20);
          auVar9._0_8_ = sVar5;
          auVar9._12_4_ = 0x45300000;
          vecInDeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1] =
               (uint)(float)(1.0 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end4);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)probDist);
    iVar2 = tolower((int)*pcVar3);
    if (iVar2 == 0x74) {
      local_48 = 0;
      local_20 = &dsfmt_global_data;
      local_24 = 0;
      dsfmt_chk_init_gen_rand(&dsfmt_global_data,0,0x4de1);
      stack0xfffffffffffffe6c = 0x3c23d70a3a83126f;
      pProb[0] = 0.1;
      __end3_3 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::begin(__return_storage_ptr__);
      nbrs_3 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)std::
                  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ::end(__return_storage_ptr__);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                 *)&nbrs_3), bVar1) {
        pvVar4 = __gnu_cxx::
                 __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                 ::operator*(&__end3_3);
        __end4_3 = std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::begin(pvVar4);
        nbr_3 = (pair<unsigned_int,_float> *)
                std::
                vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::end(pvVar4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_3,
                                  (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)&nbr_3), bVar1) {
          ppVar6 = __gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                   ::operator*(&__end4_3);
          local_44 = 3;
          pdStack_30 = &dsfmt_global_data;
          local_40 = &dsfmt_global_data;
          if (0x17d < dsfmt_global_data.idx) {
            dsfmt_gen_rand_all(&dsfmt_global_data);
            pdStack_30->idx = 0;
          }
          iVar2 = pdStack_30->idx;
          pdStack_30->idx = iVar2 + 1;
          psfmt64._4_4_ = (uint)local_40->status[0].u[iVar2];
          ppVar6->second = *(float *)((long)&__range3_3 + (ulong)(psfmt64._4_4_ % local_44) * 4 + 4)
          ;
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end4_3);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
        ::operator++(&__end3_3);
      }
      tVar8 = time((time_t *)0x0);
      graph._4_4_ = (uint32_t)tVar8;
      local_10 = &dsfmt_global_data;
      local_14 = graph._4_4_;
      dsfmt_chk_init_gen_rand(&dsfmt_global_data,graph._4_4_,0x4de1);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)probDist);
      iVar2 = tolower((int)*pcVar3);
      if (iVar2 == 0x75) {
        __end4_4 = std::
                   vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ::begin(__return_storage_ptr__);
        nbrs_4 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  *)std::
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ::end(__return_storage_ptr__);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_4,
                                  (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                   *)&nbrs_4), bVar1) {
          pvVar4 = __gnu_cxx::
                   __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                   ::operator*(&__end4_4);
          __end5 = std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::begin(pvVar4);
          nbr_4 = (pair<unsigned_int,_float> *)
                  std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::end(pvVar4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                             *)&nbr_4), bVar1) {
            ppVar6 = __gnu_cxx::
                     __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                     ::operator*(&__end5);
            ppVar6->second = local_74;
            __gnu_cxx::
            __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
            ::operator++(&__end5);
          }
          __gnu_cxx::
          __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
          ::operator++(&__end4_4);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Graph load_graph(const std::string graphName, const bool isReverse, const std::string probDist = "load",
                            const float probEdge = float(0.1))
    {
        Graph graph;
        TIO::load_graph_struct(graphName, graph, isReverse);

        // Default is to load the edge including the diffusion probability from the file.
        // The following changes the setting of diffusion probability.
        if (tolower(probDist[0]) == 'w')
        {
            // Weighted cascade
            if (isReverse)
            {
                // Reverse graph
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = float(1.0 / nbrs.size());
                    }
                }
            }
            else
            {
                // Forward graph
                std::vector<uint32_t> vecInDeg(graph.size());
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        vecInDeg[nbr.first]++;
                    }
                }
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = (float)1.0 / vecInDeg[nbr.first];
                    }
                }
            }

        }
        else if (tolower(probDist[0]) == 't')
        {
            // Trivalency cascade
            dsfmt_gv_init_gen_rand(0);
            float pProb[3] = {float(0.001), float(0.01), float(0.1)};
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = pProb[dsfmt_gv_genrand_uint32_range(3)];
                }
            }
            dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
        }
        else if (tolower(probDist[0]) == 'u')
        {
            // Uniform probability
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = probEdge;
                }
            }
        }
        return graph;
    }